

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitSub(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,BinaryExpr e)

{
  ExprBase e_00;
  BucketAccumulator<mp::EExpr> *in_RSI;
  ExprBase in_RDI;
  EExpr er;
  BucketAccumulator<mp::EExpr> ba;
  EExpr *in_stack_ffffffffffff8c38;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_ffffffffffff8c40;
  BucketAccumulator<mp::EExpr> *this_00;
  ExprBase in_stack_ffffffffffff8c48;
  EExpr *pEVar1;
  type in_stack_ffffffffffff8e18;
  EExpr *in_stack_ffffffffffff8e28;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8e30;
  ExprBase this_01;
  
  pEVar1 = (EExpr *)in_RDI.impl_;
  BucketAccumulator<mp::EExpr>::BucketAccumulator(in_RSI,(size_t)in_RDI.impl_);
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
  ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
         *)in_stack_ffffffffffff8c38);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffff8c48.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RDI.impl_,
             (type_conflict)((ulong)in_stack_ffffffffffff8c40 >> 0x20));
  Convert2EExpr(in_stack_ffffffffffff8c40,(Expr)in_stack_ffffffffffff8c48.impl_);
  BucketAccumulator<mp::EExpr>::Add(in_stack_ffffffffffff8e30,in_stack_ffffffffffff8e28);
  EExpr::~EExpr((EExpr *)0x61a9e5);
  e_00.impl_ = (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                       ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                              *)in_stack_ffffffffffff8c38);
  this_01.impl_ = e_00.impl_;
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e_00.impl_,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_RDI.impl_,
             (type_conflict)((ulong)in_stack_ffffffffffff8c40 >> 0x20));
  Convert2EExpr(in_stack_ffffffffffff8c40,(Expr)e_00.impl_);
  AlgebraicExpression<mp::QuadAndLinTerms>::negate
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)in_stack_ffffffffffff8c40);
  this_00 = (BucketAccumulator<mp::EExpr> *)&stack0xffffffffffff8c70;
  EExpr::EExpr((EExpr *)this_00,in_stack_ffffffffffff8c38);
  BucketAccumulator<mp::EExpr>::Add
            ((BucketAccumulator<mp::EExpr> *)this_01.impl_,in_stack_ffffffffffff8e28);
  EExpr::~EExpr((EExpr *)0x61aa7f);
  BucketAccumulator<mp::EExpr>::ExtractSum
            ((BucketAccumulator<mp::EExpr> *)in_stack_ffffffffffff8e18);
  EExpr::~EExpr((EExpr *)0x61aaa0);
  BucketAccumulator<mp::EExpr>::~BucketAccumulator(this_00);
  return pEVar1;
}

Assistant:

EExpr VisitSub(BinaryExpr e) {
    BucketAccumulator<EExpr> ba;
    ba.Add( Convert2EExpr(e.lhs()) );
    auto er = Convert2EExpr(e.rhs());
    er.negate();
    ba.Add( std::move(er) );
    return ba.ExtractSum();
  }